

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_progress.c
# Opt level: O0

void progress_finalize(per_transfer *per)

{
  per_transfer *per_local;
  
  all_dlalready = per->dlnow + all_dlalready;
  all_ulalready = per->ulnow + all_ulalready;
  if ((per->dltotal_added & 1U) == 0) {
    all_dltotal = per->dltotal + all_dltotal;
    per->dltotal_added = true;
  }
  if ((per->ultotal_added & 1U) == 0) {
    all_ultotal = per->ultotal + all_ultotal;
    per->ultotal_added = true;
  }
  return;
}

Assistant:

void progress_finalize(struct per_transfer *per)
{
  /* get the numbers before this transfer goes away */
  all_dlalready += per->dlnow;
  all_ulalready += per->ulnow;
  if(!per->dltotal_added) {
    all_dltotal += per->dltotal;
    per->dltotal_added = TRUE;
  }
  if(!per->ultotal_added) {
    all_ultotal += per->ultotal;
    per->ultotal_added = TRUE;
  }
}